

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineImageTests.cpp
# Opt level: O1

TestCaseGroup * vkt::pipeline::createImageTests(TestContext *testCtx)

{
  pointer piVar1;
  void *pvVar2;
  _Alloc_hider name;
  ulong uVar3;
  bool bVar4;
  undefined8 *puVar5;
  long *plVar6;
  TestNode *pTVar7;
  TestNode *this;
  ostream *poVar8;
  long lVar9;
  char *pcVar10;
  long *plVar11;
  char *pcVar12;
  int *piVar13;
  ulong uVar14;
  int iVar15;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar16;
  vector<int,_std::allocator<int>_> arraySizes;
  vector<tcu::Vector<int,_3>,_std::allocator<tcu::Vector<int,_3>_>_> imageSizes;
  string fullName;
  ostringstream caseName;
  long local_430;
  vector<int,_std::allocator<int>_> local_428;
  TestContext *local_410;
  void *local_408;
  void *pvStack_400;
  long local_3f8;
  string local_3e8;
  TestNode *local_3c8;
  TestNode *local_3c0;
  VkFormat local_3b8;
  allocator<char> local_3b1;
  TestNode *local_3b0;
  ulong local_3a8;
  TestNode *local_3a0;
  TestNode *local_398;
  TestNode *local_390;
  TestNode *local_388;
  TestNode *local_380;
  long local_378;
  ulong local_370;
  Precision local_368;
  int local_364;
  undefined1 local_360 [16];
  long local_350;
  long lStack_348;
  ios_base local_2f0 [264];
  long local_1e8;
  long local_1e0;
  long *local_1d8 [2];
  long local_1c8 [2];
  long local_1b8;
  _func_int **local_1b0;
  string local_1a8 [3];
  ios_base local_138 [264];
  
  local_380 = (TestNode *)operator_new(0x70);
  local_410 = testCtx;
  tcu::TestCaseGroup::TestCaseGroup((TestCaseGroup *)local_380,testCtx,"image","Image tests");
  local_3c8 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup((TestCaseGroup *)local_3c8,local_410,"sampling_type","");
  local_1b0 = (_func_int **)&PTR__TestCase_00d1aed0;
  lVar9 = 0;
  do {
    pcVar12 = "separate";
    if (lVar9 == 0) {
      pcVar12 = "combined";
    }
    local_1e8 = lVar9;
    local_3a0 = (TestNode *)operator_new(0x70);
    local_3e8.field_2._M_local_buf[0] = 'U';
    local_3e8.field_2._M_allocated_capacity._1_2_ = 0x6573;
    local_3e8.field_2._M_allocated_capacity._3_4_ = 0x20612073;
    local_3e8._M_string_length = 7;
    local_3e8.field_2._M_local_buf[7] = '\0';
    local_3e8._M_dataplus._M_p = (pointer)&local_3e8.field_2;
    puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_3e8);
    pcVar10 = (char *)(puVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar10) {
      local_1a8[0].field_2._0_8_ = *(undefined8 *)pcVar10;
      local_1a8[0].field_2._8_8_ = puVar5[3];
      local_1a8[0]._M_dataplus._M_p = (pointer)&local_1a8[0].field_2;
    }
    else {
      local_1a8[0].field_2._0_8_ = *(undefined8 *)pcVar10;
      local_1a8[0]._M_dataplus._M_p = (pointer)*puVar5;
    }
    local_1a8[0]._M_string_length = puVar5[1];
    *puVar5 = pcVar10;
    puVar5[1] = 0;
    *(undefined1 *)(puVar5 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)local_1a8);
    local_360._0_8_ = &local_350;
    plVar11 = plVar6 + 2;
    if ((long *)*plVar6 == plVar11) {
      local_350 = *plVar11;
      lStack_348 = plVar6[3];
    }
    else {
      local_350 = *plVar11;
      local_360._0_8_ = (long *)*plVar6;
    }
    local_360._8_8_ = plVar6[1];
    *plVar6 = (long)plVar11;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)local_3a0,local_410,pcVar12,(char *)local_360._0_8_);
    if ((long *)local_360._0_8_ != &local_350) {
      operator_delete((void *)local_360._0_8_,local_350 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
      operator_delete(local_1a8[0]._M_dataplus._M_p,local_1a8[0].field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3e8._M_dataplus._M_p != &local_3e8.field_2) {
      operator_delete(local_3e8._M_dataplus._M_p,
                      CONCAT17(local_3e8.field_2._M_local_buf[7],
                               CONCAT43(local_3e8.field_2._M_allocated_capacity._3_4_,
                                        CONCAT21(local_3e8.field_2._M_allocated_capacity._1_2_,
                                                 local_3e8.field_2._M_local_buf[0]))) + 1);
    }
    local_368 = vkt::sr::anon_unknown_0::ShaderMatrixTests::init::precisions[local_1e8];
    local_3c0 = (TestNode *)operator_new(0x70);
    tcu::TestCaseGroup::TestCaseGroup((TestCaseGroup *)local_3c0,local_410,"view_type","");
    lVar9 = 0;
    do {
      local_3a8 = (ulong)(uint)(&DAT_00d20e30)[lVar9 * 4];
      local_1b8 = lVar9;
      local_398 = (TestNode *)operator_new(0x70);
      pcVar12 = (char *)(&DAT_00d20e38)[lVar9 * 2];
      local_3e8.field_2._M_local_buf[0] = 'U';
      local_3e8.field_2._M_allocated_capacity._1_2_ = 0x6573;
      local_3e8.field_2._M_allocated_capacity._3_4_ = 0x20612073;
      local_3e8._M_string_length = 7;
      local_3e8.field_2._M_local_buf[7] = '\0';
      local_3e8._M_dataplus._M_p = (pointer)&local_3e8.field_2;
      puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_3e8);
      pcVar10 = (char *)(puVar5 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar5 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar10) {
        local_1a8[0].field_2._0_8_ = *(undefined8 *)pcVar10;
        local_1a8[0].field_2._8_8_ = puVar5[3];
        local_1a8[0]._M_dataplus._M_p = (pointer)&local_1a8[0].field_2;
      }
      else {
        local_1a8[0].field_2._0_8_ = *(undefined8 *)pcVar10;
        local_1a8[0]._M_dataplus._M_p = (pointer)*puVar5;
      }
      local_1a8[0]._M_string_length = puVar5[1];
      *puVar5 = pcVar10;
      puVar5[1] = 0;
      *(undefined1 *)(puVar5 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::append((char *)local_1a8);
      local_360._0_8_ = &local_350;
      plVar11 = plVar6 + 2;
      if ((long *)*plVar6 == plVar11) {
        local_350 = *plVar11;
        lStack_348 = plVar6[3];
      }
      else {
        local_350 = *plVar11;
        local_360._0_8_ = (long *)*plVar6;
      }
      local_360._8_8_ = plVar6[1];
      *plVar6 = (long)plVar11;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)local_398,local_410,pcVar12,(char *)local_360._0_8_);
      if ((long *)local_360._0_8_ != &local_350) {
        operator_delete((void *)local_360._0_8_,local_350 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
        operator_delete(local_1a8[0]._M_dataplus._M_p,local_1a8[0].field_2._M_allocated_capacity + 1
                       );
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3e8._M_dataplus._M_p != &local_3e8.field_2) {
        operator_delete(local_3e8._M_dataplus._M_p,
                        CONCAT17(local_3e8.field_2._M_local_buf[7],
                                 CONCAT43(local_3e8.field_2._M_allocated_capacity._3_4_,
                                          CONCAT21(local_3e8.field_2._M_allocated_capacity._1_2_,
                                                   local_3e8.field_2._M_local_buf[0]))) + 1);
      }
      local_390 = (TestNode *)operator_new(0x70);
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)local_390,local_410,"format","Tests samplable formats");
      local_378 = 0;
      do {
        paVar16 = &local_1a8[0].field_2;
        local_3b8 = *(VkFormat *)(&DAT_00ade570 + local_378 * 4);
        bVar4 = ::vk::isCompressedFormat(local_3b8);
        if ((local_3a8 & 0xfffffffb) == 0 && bVar4) break;
        local_3b0 = (TestNode *)operator_new(0x70);
        pcVar12 = ::vk::getFormatName(local_3b8);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_360,pcVar12,(allocator<char> *)local_1a8);
        std::__cxx11::string::substr((ulong)local_1a8,(ulong)local_360);
        de::toLower(&local_3e8,local_1a8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a8[0]._M_dataplus._M_p != paVar16) {
          operator_delete(local_1a8[0]._M_dataplus._M_p,
                          local_1a8[0].field_2._M_allocated_capacity + 1);
        }
        if ((long *)local_360._0_8_ != &local_350) {
          operator_delete((void *)local_360._0_8_,local_350 + 1);
        }
        name._M_p = local_3e8._M_dataplus._M_p;
        local_1d8[0] = (long *)0x1c;
        local_1a8[0]._M_dataplus._M_p = (pointer)paVar16;
        local_1a8[0]._M_dataplus._M_p =
             (pointer)std::__cxx11::string::_M_create((ulong *)local_1a8,(ulong)local_1d8);
        local_1a8[0].field_2._M_allocated_capacity = local_1d8[0];
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1a8[0]._M_dataplus._M_p + 0xc) = 'x';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1a8[0]._M_dataplus._M_p + 0xd) = 't';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1a8[0]._M_dataplus._M_p + 0xe) = 'u';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1a8[0]._M_dataplus._M_p + 0xf) = 'r';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1a8[0]._M_dataplus._M_p + 0x10) = 'e';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1a8[0]._M_dataplus._M_p + 0x11) = ' ';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1a8[0]._M_dataplus._M_p + 0x12) = 'o';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1a8[0]._M_dataplus._M_p + 0x13) = 'f';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1a8[0]._M_dataplus._M_p + 0x14) = ' ';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1a8[0]._M_dataplus._M_p + 0x15) = 'f';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1a8[0]._M_dataplus._M_p + 0x16) = 'o';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1a8[0]._M_dataplus._M_p + 0x17) = 'r';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1a8[0]._M_dataplus._M_p + 0x18) = 'm';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1a8[0]._M_dataplus._M_p + 0x19) = 'a';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1a8[0]._M_dataplus._M_p + 0x1a) = 't';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1a8[0]._M_dataplus._M_p + 0x1b) = ' ';
        *(undefined8 *)local_1a8[0]._M_dataplus._M_p = 0x2073656c706d6153;
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1a8[0]._M_dataplus._M_p + 8) = 'a';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1a8[0]._M_dataplus._M_p + 9) = ' ';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1a8[0]._M_dataplus._M_p + 10) = 't';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1a8[0]._M_dataplus._M_p + 0xb) = 'e';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1a8[0]._M_dataplus._M_p + 0xc) = 'x';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1a8[0]._M_dataplus._M_p + 0xd) = 't';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1a8[0]._M_dataplus._M_p + 0xe) = 'u';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1a8[0]._M_dataplus._M_p + 0xf) = 'r';
        local_1a8[0]._M_string_length = (size_type)local_1d8[0];
        local_1a8[0]._M_dataplus._M_p[(long)local_1d8[0]] = '\0';
        ::vk::getFormatName(local_3b8);
        plVar6 = (long *)std::__cxx11::string::append((char *)local_1a8);
        local_360._0_8_ = &local_350;
        plVar11 = plVar6 + 2;
        if ((long *)*plVar6 == plVar11) {
          local_350 = *plVar11;
          lStack_348 = plVar6[3];
        }
        else {
          local_350 = *plVar11;
          local_360._0_8_ = (long *)*plVar6;
        }
        local_360._8_8_ = plVar6[1];
        *plVar6 = (long)plVar11;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        tcu::TestCaseGroup::TestCaseGroup
                  ((TestCaseGroup *)local_3b0,local_410,name._M_p,(char *)local_360._0_8_);
        if ((long *)local_360._0_8_ != &local_350) {
          operator_delete((void *)local_360._0_8_,local_350 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a8[0]._M_dataplus._M_p != paVar16) {
          operator_delete(local_1a8[0]._M_dataplus._M_p,
                          local_1a8[0].field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3e8._M_dataplus._M_p != &local_3e8.field_2) {
          operator_delete(local_3e8._M_dataplus._M_p,
                          CONCAT17(local_3e8.field_2._M_local_buf[7],
                                   CONCAT43(local_3e8.field_2._M_allocated_capacity._3_4_,
                                            CONCAT21(local_3e8.field_2._M_allocated_capacity._1_2_,
                                                     local_3e8.field_2._M_local_buf[0]))) + 1);
        }
        local_430 = 0;
        do {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"count_",6);
          local_364 = *(int *)(&DAT_00ade744 + local_430 * 4);
          std::ostream::operator<<(local_1a8,local_364);
          pTVar7 = (TestNode *)operator_new(0x70);
          std::__cxx11::stringbuf::str();
          tcu::TestCaseGroup::TestCaseGroup
                    ((TestCaseGroup *)pTVar7,local_410,(char *)local_360._0_8_,"");
          if ((long *)local_360._0_8_ != &local_350) {
            operator_delete((void *)local_360._0_8_,local_350 + 1);
          }
          local_3f8 = 0;
          local_408 = (void *)0x0;
          pvStack_400 = (void *)0x0;
          local_428.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage = (int *)0x0;
          local_428.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start = (int *)0x0;
          local_428.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish = (int *)0x0;
          this = (TestNode *)operator_new(0x70);
          tcu::TestCaseGroup::TestCaseGroup((TestCaseGroup *)this,local_410,"size","");
          switch(local_3a8 & 0xffffffff) {
          case 0:
          case 4:
            if (local_430 == 0) {
              local_360._0_4_ = 1;
              local_360._4_4_ = 1;
              local_360._8_4_ = 1;
              std::vector<tcu::Vector<int,3>,std::allocator<tcu::Vector<int,3>>>::
              emplace_back<tcu::Vector<int,3>>
                        ((vector<tcu::Vector<int,3>,std::allocator<tcu::Vector<int,3>>> *)&local_408
                         ,(Vector<int,_3> *)local_360);
              local_360._0_4_ = 2;
              local_360._4_4_ = 1;
              local_360._8_4_ = 1;
              std::vector<tcu::Vector<int,3>,std::allocator<tcu::Vector<int,3>>>::
              emplace_back<tcu::Vector<int,3>>
                        ((vector<tcu::Vector<int,3>,std::allocator<tcu::Vector<int,3>>> *)&local_408
                         ,(Vector<int,_3> *)local_360);
              local_360._0_4_ = 0x20;
              local_360._4_4_ = 1;
              local_360._8_4_ = 1;
              std::vector<tcu::Vector<int,3>,std::allocator<tcu::Vector<int,3>>>::
              emplace_back<tcu::Vector<int,3>>
                        ((vector<tcu::Vector<int,3>,std::allocator<tcu::Vector<int,3>>> *)&local_408
                         ,(Vector<int,_3> *)local_360);
              local_360._0_4_ = 0x80;
              local_360._4_4_ = 1;
              local_360._8_4_ = 1;
              std::vector<tcu::Vector<int,3>,std::allocator<tcu::Vector<int,3>>>::
              emplace_back<tcu::Vector<int,3>>
                        ((vector<tcu::Vector<int,3>,std::allocator<tcu::Vector<int,3>>> *)&local_408
                         ,(Vector<int,_3> *)local_360);
            }
            local_360._0_4_ = 0x200;
            local_360._4_4_ = 1;
            local_360._8_4_ = 1;
            std::vector<tcu::Vector<int,3>,std::allocator<tcu::Vector<int,3>>>::
            emplace_back<tcu::Vector<int,3>>
                      ((vector<tcu::Vector<int,3>,std::allocator<tcu::Vector<int,3>>> *)&local_408,
                       (Vector<int,_3> *)local_360);
            if (local_430 == 0) {
              local_360._0_4_ = 3;
              local_360._4_4_ = 1;
              local_360._8_4_ = 1;
              std::vector<tcu::Vector<int,3>,std::allocator<tcu::Vector<int,3>>>::
              emplace_back<tcu::Vector<int,3>>
                        ((vector<tcu::Vector<int,3>,std::allocator<tcu::Vector<int,3>>> *)&local_408
                         ,(Vector<int,_3> *)local_360);
              local_360._0_4_ = 0xd;
              local_360._4_4_ = 1;
              local_360._8_4_ = 1;
              std::vector<tcu::Vector<int,3>,std::allocator<tcu::Vector<int,3>>>::
              emplace_back<tcu::Vector<int,3>>
                        ((vector<tcu::Vector<int,3>,std::allocator<tcu::Vector<int,3>>> *)&local_408
                         ,(Vector<int,_3> *)local_360);
              local_360._0_4_ = 0x7f;
              local_360._4_4_ = 1;
              local_360._8_4_ = 1;
              std::vector<tcu::Vector<int,3>,std::allocator<tcu::Vector<int,3>>>::
              emplace_back<tcu::Vector<int,3>>
                        ((vector<tcu::Vector<int,3>,std::allocator<tcu::Vector<int,3>>> *)&local_408
                         ,(Vector<int,_3> *)local_360);
            }
            local_360._0_8_ = (long *)0x1000001bb;
            local_360._8_4_ = 1;
            std::vector<tcu::Vector<int,3>,std::allocator<tcu::Vector<int,3>>>::
            emplace_back<tcu::Vector<int,3>>
                      ((vector<tcu::Vector<int,3>,std::allocator<tcu::Vector<int,3>>> *)&local_408,
                       (Vector<int,_3> *)local_360);
            break;
          case 1:
          case 5:
            if (local_430 == 0) {
              local_360._0_4_ = 1;
              local_360._4_4_ = 1;
              local_360._8_4_ = 1;
              std::vector<tcu::Vector<int,3>,std::allocator<tcu::Vector<int,3>>>::
              emplace_back<tcu::Vector<int,3>>
                        ((vector<tcu::Vector<int,3>,std::allocator<tcu::Vector<int,3>>> *)&local_408
                         ,(Vector<int,_3> *)local_360);
              local_360._0_4_ = 2;
              local_360._4_4_ = 2;
              local_360._8_4_ = 1;
              std::vector<tcu::Vector<int,3>,std::allocator<tcu::Vector<int,3>>>::
              emplace_back<tcu::Vector<int,3>>
                        ((vector<tcu::Vector<int,3>,std::allocator<tcu::Vector<int,3>>> *)&local_408
                         ,(Vector<int,_3> *)local_360);
              local_360._0_4_ = 0x20;
              local_360._4_4_ = 0x20;
              local_360._8_4_ = 1;
              std::vector<tcu::Vector<int,3>,std::allocator<tcu::Vector<int,3>>>::
              emplace_back<tcu::Vector<int,3>>
                        ((vector<tcu::Vector<int,3>,std::allocator<tcu::Vector<int,3>>> *)&local_408
                         ,(Vector<int,_3> *)local_360);
              local_360._0_4_ = 3;
              local_360._4_4_ = 3;
              local_360._8_4_ = 1;
              std::vector<tcu::Vector<int,3>,std::allocator<tcu::Vector<int,3>>>::
              emplace_back<tcu::Vector<int,3>>
                        ((vector<tcu::Vector<int,3>,std::allocator<tcu::Vector<int,3>>> *)&local_408
                         ,(Vector<int,_3> *)local_360);
              local_360._0_4_ = 0xd;
              local_360._4_4_ = 0xd;
              local_360._8_4_ = 1;
              std::vector<tcu::Vector<int,3>,std::allocator<tcu::Vector<int,3>>>::
              emplace_back<tcu::Vector<int,3>>
                        ((vector<tcu::Vector<int,3>,std::allocator<tcu::Vector<int,3>>> *)&local_408
                         ,(Vector<int,_3> *)local_360);
              local_360._0_4_ = 8;
              local_360._4_4_ = 0x10;
              local_360._8_4_ = 1;
              std::vector<tcu::Vector<int,3>,std::allocator<tcu::Vector<int,3>>>::
              emplace_back<tcu::Vector<int,3>>
                        ((vector<tcu::Vector<int,3>,std::allocator<tcu::Vector<int,3>>> *)&local_408
                         ,(Vector<int,_3> *)local_360);
            }
            local_360._0_4_ = 0x20;
            local_360._4_4_ = 0x10;
            local_360._8_4_ = 1;
            std::vector<tcu::Vector<int,3>,std::allocator<tcu::Vector<int,3>>>::
            emplace_back<tcu::Vector<int,3>>
                      ((vector<tcu::Vector<int,3>,std::allocator<tcu::Vector<int,3>>> *)&local_408,
                       (Vector<int,_3> *)local_360);
            local_360._0_8_ = (long *)0x170000000d;
            local_360._8_4_ = 1;
            std::vector<tcu::Vector<int,3>,std::allocator<tcu::Vector<int,3>>>::
            emplace_back<tcu::Vector<int,3>>
                      ((vector<tcu::Vector<int,3>,std::allocator<tcu::Vector<int,3>>> *)&local_408,
                       (Vector<int,_3> *)local_360);
            if (local_430 == 0) {
              local_360._0_8_ = (long *)0x800000017;
              local_360._8_4_ = 1;
              std::vector<tcu::Vector<int,3>,std::allocator<tcu::Vector<int,3>>>::
              emplace_back<tcu::Vector<int,3>>
                        ((vector<tcu::Vector<int,3>,std::allocator<tcu::Vector<int,3>>> *)&local_408
                         ,(Vector<int,_3> *)local_360);
            }
            break;
          case 2:
            if (local_430 == 0) {
              local_360._0_4_ = 1;
              local_360._4_4_ = 1;
              local_360._8_4_ = 1;
              std::vector<tcu::Vector<int,3>,std::allocator<tcu::Vector<int,3>>>::
              emplace_back<tcu::Vector<int,3>>
                        ((vector<tcu::Vector<int,3>,std::allocator<tcu::Vector<int,3>>> *)&local_408
                         ,(Vector<int,_3> *)local_360);
              local_360._0_4_ = 2;
              local_360._4_4_ = 2;
              local_360._8_4_ = 2;
              std::vector<tcu::Vector<int,3>,std::allocator<tcu::Vector<int,3>>>::
              emplace_back<tcu::Vector<int,3>>
                        ((vector<tcu::Vector<int,3>,std::allocator<tcu::Vector<int,3>>> *)&local_408
                         ,(Vector<int,_3> *)local_360);
            }
            local_360._0_4_ = 0x10;
            local_360._4_4_ = 0x10;
            local_360._8_4_ = 0x10;
            std::vector<tcu::Vector<int,3>,std::allocator<tcu::Vector<int,3>>>::
            emplace_back<tcu::Vector<int,3>>
                      ((vector<tcu::Vector<int,3>,std::allocator<tcu::Vector<int,3>>> *)&local_408,
                       (Vector<int,_3> *)local_360);
            if (local_430 == 0) {
              local_360._0_4_ = 3;
              local_360._4_4_ = 3;
              local_360._8_4_ = 3;
              std::vector<tcu::Vector<int,3>,std::allocator<tcu::Vector<int,3>>>::
              emplace_back<tcu::Vector<int,3>>
                        ((vector<tcu::Vector<int,3>,std::allocator<tcu::Vector<int,3>>> *)&local_408
                         ,(Vector<int,_3> *)local_360);
              local_360._0_4_ = 5;
              local_360._4_4_ = 5;
              local_360._8_4_ = 5;
              std::vector<tcu::Vector<int,3>,std::allocator<tcu::Vector<int,3>>>::
              emplace_back<tcu::Vector<int,3>>
                        ((vector<tcu::Vector<int,3>,std::allocator<tcu::Vector<int,3>>> *)&local_408
                         ,(Vector<int,_3> *)local_360);
            }
            local_360._0_4_ = 0xb;
            local_360._4_4_ = 0xb;
            local_360._8_4_ = 0xb;
            std::vector<tcu::Vector<int,3>,std::allocator<tcu::Vector<int,3>>>::
            emplace_back<tcu::Vector<int,3>>
                      ((vector<tcu::Vector<int,3>,std::allocator<tcu::Vector<int,3>>> *)&local_408,
                       (Vector<int,_3> *)local_360);
            if (local_430 == 0) {
              local_360._0_4_ = 0x20;
              local_360._4_4_ = 0x10;
              local_360._8_4_ = 8;
              std::vector<tcu::Vector<int,3>,std::allocator<tcu::Vector<int,3>>>::
              emplace_back<tcu::Vector<int,3>>
                        ((vector<tcu::Vector<int,3>,std::allocator<tcu::Vector<int,3>>> *)&local_408
                         ,(Vector<int,_3> *)local_360);
            }
            local_360._0_4_ = 8;
            local_360._4_4_ = 0x10;
            local_360._8_4_ = 0x20;
            std::vector<tcu::Vector<int,3>,std::allocator<tcu::Vector<int,3>>>::
            emplace_back<tcu::Vector<int,3>>
                      ((vector<tcu::Vector<int,3>,std::allocator<tcu::Vector<int,3>>> *)&local_408,
                       (Vector<int,_3> *)local_360);
            local_360._0_8_ = (long *)0xb00000011;
            local_360._8_4_ = 5;
            std::vector<tcu::Vector<int,3>,std::allocator<tcu::Vector<int,3>>>::
            emplace_back<tcu::Vector<int,3>>
                      ((vector<tcu::Vector<int,3>,std::allocator<tcu::Vector<int,3>>> *)&local_408,
                       (Vector<int,_3> *)local_360);
            if (local_430 == 0) {
              local_360._0_8_ = (long *)0xb00000005;
              local_360._8_4_ = 0x11;
              std::vector<tcu::Vector<int,3>,std::allocator<tcu::Vector<int,3>>>::
              emplace_back<tcu::Vector<int,3>>
                        ((vector<tcu::Vector<int,3>,std::allocator<tcu::Vector<int,3>>> *)&local_408
                         ,(Vector<int,_3> *)local_360);
            }
            break;
          case 3:
          case 6:
            local_360._0_4_ = 0x20;
            local_360._4_4_ = 0x20;
            local_360._8_4_ = 1;
            std::vector<tcu::Vector<int,3>,std::allocator<tcu::Vector<int,3>>>::
            emplace_back<tcu::Vector<int,3>>
                      ((vector<tcu::Vector<int,3>,std::allocator<tcu::Vector<int,3>>> *)&local_408,
                       (Vector<int,_3> *)local_360);
            local_360._0_8_ = (long *)0xd0000000d;
            local_360._8_4_ = 1;
            std::vector<tcu::Vector<int,3>,std::allocator<tcu::Vector<int,3>>>::
            emplace_back<tcu::Vector<int,3>>
                      ((vector<tcu::Vector<int,3>,std::allocator<tcu::Vector<int,3>>> *)&local_408,
                       (Vector<int,_3> *)local_360);
            break;
          default:
            goto switchD_00488f87_default;
          }
          iVar15 = (int)local_3a8;
          if (iVar15 - 4U < 2) {
            if (local_430 == 0) {
              local_360._0_4_ = 3;
              if (local_428.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish ==
                  local_428.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                          (&local_428,
                           (iterator)
                           local_428.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish,(int *)local_360);
              }
              else {
                *local_428.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish = 3;
                local_428.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish =
                     local_428.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish + 1;
              }
            }
            local_360._0_4_ = 6;
            if (local_428.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish !=
                local_428.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
LAB_0048964e:
              *local_428.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish = 6;
              goto LAB_0048969d;
            }
            std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                      (&local_428,
                       (iterator)
                       local_428.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish,(int *)local_360);
          }
          else if (iVar15 == 3) {
            local_360._0_4_ = 6;
            if (local_428.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish !=
                local_428.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) goto LAB_0048964e;
            std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                      (&local_428,
                       (iterator)
                       local_428.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish,(int *)local_360);
          }
          else if (iVar15 == 6) {
            if (local_430 == 0) {
              local_360._0_4_ = 6;
              if (local_428.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish ==
                  local_428.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                          (&local_428,
                           (iterator)
                           local_428.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish,(int *)local_360);
              }
              else {
                *local_428.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish = 6;
                local_428.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish =
                     local_428.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish + 1;
              }
            }
            local_360._0_4_ = 0x24;
            if (local_428.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                local_428.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                        (&local_428,
                         (iterator)
                         local_428.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish,(int *)local_360);
            }
            else {
              *local_428.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish = 0x24;
LAB_0048969d:
              local_428.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   local_428.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish + 1;
            }
          }
          else {
switchD_00488f87_default:
            local_360._0_4_ = 1;
            if (local_428.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish !=
                local_428.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              *local_428.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish = 1;
              goto LAB_0048969d;
            }
            std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                      (&local_428,
                       (iterator)
                       local_428.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish,(int *)local_360);
          }
          local_388 = pTVar7;
          if (pvStack_400 != local_408) {
            local_1e0 = 0;
            local_370 = 0;
            do {
              if (local_428.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish !=
                  local_428.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start) {
                uVar14 = 0;
                do {
                  piVar1 = local_428.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start;
                  pTVar7 = (TestNode *)operator_new(0x90);
                  piVar13 = (int *)(local_370 * 0xc + (long)local_408);
                  iVar15 = piVar1[uVar14];
                  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_360);
                  if ((uint)local_3a8 < 7) {
                    if ((0xbU >> ((uint)local_3a8 & 0x1f) & 1) == 0) {
                      if ((0x70U >> ((uint)local_3a8 & 0x1f) & 1) == 0) {
                        poVar8 = (ostream *)std::ostream::operator<<(local_360,*piVar13);
                        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"x",1);
                        poVar8 = (ostream *)std::ostream::operator<<(poVar8,piVar13[1]);
                        lVar9 = 8;
                        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"x",1);
                        goto LAB_0048980e;
                      }
                      poVar8 = (ostream *)std::ostream::operator<<(local_360,*piVar13);
                      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"x",1);
                      poVar8 = (ostream *)std::ostream::operator<<(poVar8,piVar13[1]);
                      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"_array_of_",10);
                    }
                    else {
                      poVar8 = (ostream *)std::ostream::operator<<(local_360,*piVar13);
                      lVar9 = 4;
                      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"x",1);
LAB_0048980e:
                      iVar15 = *(int *)((long)piVar13 + lVar9);
                    }
                    std::ostream::operator<<(poVar8,iVar15);
                  }
                  std::__cxx11::stringbuf::str();
                  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_360);
                  std::ios_base::~ios_base(local_2f0);
                  pvVar2 = local_408;
                  iVar15 = local_428.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start[uVar14];
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)local_360,(char *)local_1d8[0],&local_3b1);
                  paVar16 = &local_3e8.field_2;
                  local_3e8._M_string_length = 0;
                  local_3e8.field_2._M_local_buf[0] = '\0';
                  local_3e8._M_dataplus._M_p = (pointer)paVar16;
                  tcu::TestCase::TestCase
                            ((TestCase *)pTVar7,local_410,(char *)local_360._0_8_,
                             paVar16->_M_local_buf);
                  pTVar7->_vptr_TestNode = local_1b0;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_3e8._M_dataplus._M_p != paVar16) {
                    operator_delete(local_3e8._M_dataplus._M_p,
                                    CONCAT17(local_3e8.field_2._M_local_buf[7],
                                             CONCAT43(local_3e8.field_2._M_allocated_capacity._3_4_,
                                                      CONCAT21(local_3e8.field_2.
                                                               _M_allocated_capacity._1_2_,
                                                               local_3e8.field_2._M_local_buf[0])))
                                    + 1);
                  }
                  uVar3 = local_3a8;
                  if ((long *)local_360._0_8_ != &local_350) {
                    operator_delete((void *)local_360._0_8_,local_350 + 1);
                  }
                  pTVar7->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d20eb0;
                  *(Precision *)&pTVar7[1]._vptr_TestNode = local_368;
                  *(int *)((long)&pTVar7[1]._vptr_TestNode + 4) = (int)uVar3;
                  *(VkFormat *)&pTVar7[1].m_testCtx = local_3b8;
                  lVar9 = 0;
                  do {
                    *(undefined4 *)((long)&pTVar7[1].m_testCtx + lVar9 * 4 + 4) =
                         *(undefined4 *)((long)pvVar2 + lVar9 * 4 + local_1e0);
                    lVar9 = lVar9 + 1;
                  } while (lVar9 != 3);
                  *(int *)&pTVar7[1].m_name._M_string_length = local_364;
                  *(int *)((long)&pTVar7[1].m_name._M_string_length + 4) = iVar15;
                  tcu::TestNode::addChild(this,pTVar7);
                  if (local_1d8[0] != local_1c8) {
                    operator_delete(local_1d8[0],local_1c8[0] + 1);
                  }
                  uVar14 = uVar14 + 1;
                } while (uVar14 < (ulong)((long)local_428.
                                                super__Vector_base<int,_std::allocator<int>_>.
                                                _M_impl.super__Vector_impl_data._M_finish -
                                          (long)local_428.
                                                super__Vector_base<int,_std::allocator<int>_>.
                                                _M_impl.super__Vector_impl_data._M_start >> 2));
              }
              local_370 = local_370 + 1;
              local_1e0 = local_1e0 + 0xc;
            } while (local_370 <
                     (ulong)(((long)pvStack_400 - (long)local_408 >> 2) * -0x5555555555555555));
          }
          if (local_428.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start != (int *)0x0) {
            operator_delete(local_428.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_428.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage -
                            (long)local_428.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start);
          }
          if (local_408 != (void *)0x0) {
            operator_delete(local_408,local_3f8 - (long)local_408);
          }
          pTVar7 = local_388;
          tcu::TestNode::addChild(local_388,this);
          tcu::TestNode::addChild(local_3b0,pTVar7);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
          std::ios_base::~ios_base(local_138);
          local_430 = local_430 + 1;
        } while (local_430 != 3);
        tcu::TestNode::addChild(local_390,local_3b0);
        local_378 = local_378 + 1;
      } while (local_378 != 0x75);
      pTVar7 = local_398;
      tcu::TestNode::addChild(local_398,local_390);
      tcu::TestNode::addChild(local_3c0,pTVar7);
      pTVar7 = local_3a0;
      lVar9 = local_1b8 + 1;
    } while (lVar9 != 7);
    tcu::TestNode::addChild(local_3a0,local_3c0);
    tcu::TestNode::addChild(local_3c8,pTVar7);
    pTVar7 = local_380;
    lVar9 = local_1e8 + 1;
    if (local_1e8 != 0) {
      tcu::TestNode::addChild(local_380,local_3c8);
      return (TestCaseGroup *)pTVar7;
    }
  } while( true );
}

Assistant:

tcu::TestCaseGroup* createImageTests (tcu::TestContext& testCtx)
{
	de::MovePtr<tcu::TestCaseGroup> imageTests(new tcu::TestCaseGroup(testCtx, "image", "Image tests"));
	de::MovePtr<tcu::TestCaseGroup> samplingTypeTests = createImageSamplingTypeTests(testCtx);

	imageTests->addChild(samplingTypeTests.release());

	return imageTests.release();
}